

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::io::anon_unknown_0::PrinterTest_BasicPrinting_Test::
~PrinterTest_BasicPrinting_Test(PrinterTest_BasicPrinting_Test *this)

{
  PrinterTest::~PrinterTest(&this->super_PrinterTest);
  operator_delete(this,0x48);
  return;
}

Assistant:

TEST_F(PrinterTest, BasicPrinting) {
  {
    Printer printer(output(), '\0');

    printer.Print("Hello World!");
    printer.Print("  This is the same line.\n");
    printer.Print("But this is a new one.\nAnd this is another one.");
    EXPECT_FALSE(printer.failed());
  }

  EXPECT_EQ(written(),
            "Hello World!  This is the same line.\n"
            "But this is a new one.\n"
            "And this is another one.");
}